

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t process_head_main(archive_read *a,rar5 *rar,archive_entry *entry,size_t block_flags)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint64_t v;
  uint64_t extra_data_size;
  ulong local_38;
  uint64_t local_30;
  
  local_30 = 0;
  if (((ulong)entry & 1) == 0) {
    local_30 = 0;
  }
  else {
    wVar4 = read_var(a,&local_30,(uint64_t *)0x0);
    if (wVar4 == L'\0') {
      return L'\x01';
    }
  }
  wVar4 = read_var(a,&local_38,(uint64_t *)0x0);
  if (wVar4 != L'\0') {
    *(byte *)&rar->main =
         (byte)((local_38 & 0xffffffff) >> 2) & 1 | (char)local_38 * '\x02' & 2U |
         *(byte *)&rar->main & 0xfc;
    if ((local_38 & 2) == 0) {
      (rar->main).vol_no = 0;
    }
    else {
      bVar2 = false;
      wVar4 = read_var(a,&local_38,(uint64_t *)0x0);
      if (wVar4 == L'\0') {
        wVar4 = L'\x01';
      }
      else if (local_38 >> 0x20 == 0) {
        (rar->main).vol_no = (uint)local_38;
        bVar2 = true;
        wVar4 = L'\0';
      }
      else {
        bVar2 = false;
        archive_set_error(&a->archive,0x54,"Invalid volume number");
        wVar4 = L'\xffffffe2';
      }
      if (!bVar2) {
        return wVar4;
      }
    }
    uVar1 = (rar->vol).expected_vol_no;
    if ((uVar1 == 0) || ((rar->main).vol_no == uVar1)) {
      if (local_30 == 0) {
        return L'\0';
      }
      wVar4 = read_var(a,&local_38,(uint64_t *)0x0);
      uVar3 = local_38;
      if (wVar4 != L'\0') {
        wVar5 = read_var(a,&local_38,(uint64_t *)0x0);
        if (wVar5 == L'\0') {
          return L'\x01';
        }
        if ((wVar4 == L'\0') || (uVar3 == 0)) {
          archive_set_error(&a->archive,0x54,"Invalid extra field size");
        }
        else {
          if (local_38 == 1) {
            wVar4 = process_main_locator_extra_block(a,rar);
            return wVar4;
          }
          archive_set_error(&a->archive,0x54,"Unsupported extra type (0x%jx)",local_38);
        }
        return L'\xffffffe2';
      }
    }
  }
  return L'\x01';
}

Assistant:

static int process_head_main(struct archive_read* a, struct rar5* rar,
    struct archive_entry* entry, size_t block_flags)
{
	int ret;
	uint64_t extra_data_size = 0;
	size_t extra_field_size = 0;
	size_t extra_field_id = 0;
	size_t archive_flags = 0;

	enum MAIN_FLAGS {
		VOLUME = 0x0001,         /* multi-volume archive */
		VOLUME_NUMBER = 0x0002,  /* volume number, first vol doesn't
					  * have it */
		SOLID = 0x0004,          /* solid archive */
		PROTECT = 0x0008,        /* contains Recovery info */
		LOCK = 0x0010,           /* readonly flag, not used */
	};

	enum MAIN_EXTRA {
		// Just one attribute here.
		LOCATOR = 0x01,
	};

	(void) entry;

	if(block_flags & HFL_EXTRA_DATA) {
		if(!read_var(a, &extra_data_size, NULL))
			return ARCHIVE_EOF;
	} else {
		extra_data_size = 0;
	}

	if(!read_var_sized(a, &archive_flags, NULL)) {
		return ARCHIVE_EOF;
	}

	rar->main.volume = (archive_flags & VOLUME) > 0;
	rar->main.solid = (archive_flags & SOLID) > 0;

	if(archive_flags & VOLUME_NUMBER) {
		size_t v = 0;
		if(!read_var_sized(a, &v, NULL)) {
			return ARCHIVE_EOF;
		}

		if (v > UINT_MAX) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid volume number");
			return ARCHIVE_FATAL;
		}

		rar->main.vol_no = (unsigned int) v;
	} else {
		rar->main.vol_no = 0;
	}

	if(rar->vol.expected_vol_no > 0 &&
		rar->main.vol_no != rar->vol.expected_vol_no)
	{
		/* Returning EOF instead of FATAL because of strange
		 * libarchive behavior. When opening multiple files via
		 * archive_read_open_filenames(), after reading up the whole
		 * last file, the __archive_read_ahead function wraps up to
		 * the first archive instead of returning EOF. */
		return ARCHIVE_EOF;
	}

	if(extra_data_size == 0) {
		/* Early return. */
		return ARCHIVE_OK;
	}

	if(!read_var_sized(a, &extra_field_size, NULL)) {
		return ARCHIVE_EOF;
	}

	if(!read_var_sized(a, &extra_field_id, NULL)) {
		return ARCHIVE_EOF;
	}

	if(extra_field_size == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid extra field size");
		return ARCHIVE_FATAL;
	}

	switch(extra_field_id) {
		case LOCATOR:
			ret = process_main_locator_extra_block(a, rar);
			if(ret != ARCHIVE_OK) {
				/* Error while parsing main locator extra
				 * block. */
				return ret;
			}

			break;
		default:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unsupported extra type (0x%jx)",
			    (uintmax_t)extra_field_id);
			return ARCHIVE_FATAL;
	}

	return ARCHIVE_OK;
}